

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  Char *Message;
  char (*in_RCX) [37];
  undefined1 local_30 [8];
  string msg;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  CheckPipelineReady(this);
  bVar1 = PipelineStateDesc::IsAnyGraphicsPipeline
                    (&(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc);
  if (!bVar1) {
    FormatString<char[26],char[37]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsAnyGraphicsPipeline()",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetNumBufferSlotsUsed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1f9);
    std::__cxx11::string::~string((string *)local_30);
  }
  return (Uint32)((this->field_6).m_pGraphicsPipelineData)->BufferSlotsUsed;
}

Assistant:

Uint32 GetNumBufferSlotsUsed() const
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsAnyGraphicsPipeline());
        return m_pGraphicsPipelineData->BufferSlotsUsed;
    }